

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O2

int __thiscall HighFreqPub::initialize(HighFreqPub *this,string *addr,int port)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  zsock_t *self;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  string newAddress;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string front;
  
  bVar1 = std::operator==(addr,"");
  if (bVar1) {
    std::__cxx11::string::assign((char *)addr);
    port = 0xc001;
  }
  std::__cxx11::string::_M_assign((string *)this);
  psVar3 = (string *)std::__cxx11::string::append((char *)addr);
  std::__cxx11::string::string((string *)&front,psVar3);
  std::__cxx11::string::string((string *)&newAddress,(string *)&front);
  std::__cxx11::to_string(&local_78,port);
  std::operator+(&local_58,"*[",&local_78);
  std::operator+(&bStack_b8,&local_58,"-]");
  std::__cxx11::string::append((string *)&newAddress);
  std::__cxx11::string::~string((string *)&bStack_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  self = zsock_new_checked(1,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                           ,0x21);
  this->hfPub = self;
  iVar2 = zsock_bind(self,"%s",newAddress._M_dataplus._M_p);
  if (iVar2 == -1) {
    iVar2 = -1;
  }
  else {
    std::__cxx11::to_string(&bStack_b8,iVar2);
    std::__cxx11::string::append((string *)&front);
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::~string((string *)&bStack_b8);
    iVar2 = 0;
  }
  std::__cxx11::string::~string((string *)&newAddress);
  std::__cxx11::string::~string((string *)&front);
  return iVar2;
}

Assistant:

int HighFreqPub::initialize(std::string addr, int port) {
    if(addr == ""){
        addr = "tcp://127.0.0.1";
        port = 49153;
    }
    sockEndpoint = addr;
    std::string front = addr.append(":");
    std::string newAddress = front;
    newAddress += "*[" + std::to_string(port) + "-]"; // zsock_bind() takes in a port value of *[p-], which means bind to first available port starting at "p"
    hfPub = zsock_new(ZMQ_PUB);
    int aPort = zsock_bind(hfPub, "%s", newAddress.c_str()); //%s just reducing warnings, one at a time
    if(aPort == -1){
        return -1;
    }
    sockEndpoint = front.append(std::to_string(aPort));
    return 0;
}